

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O3

void __thiscall
GraphBuilder::GraphBuilder(GraphBuilder *this,DGLLVMPointerAnalysis *pointsToAnalysis)

{
  this->pointsToAnalysis_ = pointsToAnalysis;
  (this->artificialNodes_)._M_h._M_buckets = &(this->artificialNodes_)._M_h._M_single_bucket;
  (this->artificialNodes_)._M_h._M_bucket_count = 1;
  (this->artificialNodes_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->artificialNodes_)._M_h._M_element_count = 0;
  (this->artificialNodes_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->artificialNodes_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->artificialNodes_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->llvmToNodeMap_)._M_h._M_buckets = &(this->llvmToNodeMap_)._M_h._M_single_bucket;
  (this->llvmToNodeMap_)._M_h._M_bucket_count = 1;
  (this->llvmToNodeMap_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->llvmToNodeMap_)._M_h._M_element_count = 0;
  (this->llvmToNodeMap_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->llvmToNodeMap_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->llvmToNodeMap_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->llvmToBlockMap_)._M_h._M_buckets = &(this->llvmToBlockMap_)._M_h._M_single_bucket;
  (this->llvmToBlockMap_)._M_h._M_bucket_count = 1;
  (this->llvmToBlockMap_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->llvmToBlockMap_)._M_h._M_element_count = 0;
  (this->llvmToBlockMap_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->llvmToBlockMap_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->llvmToBlockMap_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->llvmToFunctionMap_)._M_h._M_buckets = &(this->llvmToFunctionMap_)._M_h._M_single_bucket;
  (this->llvmToFunctionMap_)._M_h._M_bucket_count = 1;
  (this->llvmToFunctionMap_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->llvmToFunctionMap_)._M_h._M_element_count = 0;
  (this->llvmToFunctionMap_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->llvmToFunctionMap_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->llvmToFunctionMap_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->llvmToJoins_)._M_h._M_buckets = &(this->llvmToJoins_)._M_h._M_single_bucket;
  (this->llvmToJoins_)._M_h._M_bucket_count = 1;
  (this->llvmToJoins_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->llvmToJoins_)._M_h._M_element_count = 0;
  (this->llvmToJoins_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->llvmToJoins_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->llvmToJoins_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->llvmToForks_)._M_h._M_buckets = &(this->llvmToForks_)._M_h._M_single_bucket;
  (this->llvmToForks_)._M_h._M_bucket_count = 1;
  (this->llvmToForks_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->llvmToForks_)._M_h._M_element_count = 0;
  (this->llvmToForks_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->llvmToForks_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->llvmToForks_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->llvmToLocks_)._M_h._M_buckets = &(this->llvmToLocks_)._M_h._M_single_bucket;
  (this->llvmToLocks_)._M_h._M_bucket_count = 1;
  (this->llvmToLocks_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->llvmToLocks_)._M_h._M_element_count = 0;
  (this->llvmToLocks_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->llvmToLocks_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->llvmToLocks_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->llvmToUnlocks_)._M_h._M_buckets = &(this->llvmToUnlocks_)._M_h._M_single_bucket;
  (this->llvmToUnlocks_)._M_h._M_bucket_count = 1;
  (this->llvmToUnlocks_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->llvmToUnlocks_)._M_h._M_element_count = 0;
  (this->llvmToUnlocks_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->llvmToUnlocks_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->llvmToUnlocks_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

GraphBuilder::GraphBuilder(dg::DGLLVMPointerAnalysis *pointsToAnalysis)
        : pointsToAnalysis_(pointsToAnalysis) {}